

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

bool __thiscall sshash::map::save(map *this,string *filename)

{
  exception *e;
  locale local_30 [8];
  map *local_28;
  parent *p;
  string *filename_local;
  map *this_local;
  
  local_28 = this;
  p = (parent *)filename;
  filename_local = (string *)this;
  std::locale::locale(local_30);
  boost::property_tree::json_parser::
  write_json<boost::property_tree::basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>>
            (filename,&this->super_ptree,local_30,true);
  std::locale::~locale(local_30);
  return true;
}

Assistant:

bool map::save(const std::string& filename)
{
	namespace jsp = boost::property_tree::json_parser;
	try
	{
		parent &p = *this;
		jsp::write_json(filename, p);
	}
	catch (std::exception &e)
	{
		std::cerr << "Failed to write config: " << e.what() << "\n";
		return false;
	}
	return true;
}